

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

iterator __thiscall cmLinkedTree<cmDefinitions>::Pop(cmLinkedTree<cmDefinitions> *this,iterator it)

{
  iterator it_00;
  iterator iVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  bool isLast;
  cmLinkedTree<cmDefinitions> *this_local;
  iterator it_local;
  
  it_local.Tree = (cmLinkedTree<cmDefinitions> *)it.Position;
  this_local = it.Tree;
  bVar2 = std::vector<cmDefinitions,_std::allocator<cmDefinitions>_>::empty(&this->Data);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!this->Data.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                  ,0xa2,"iterator cmLinkedTree<cmDefinitions>::Pop(iterator) [T = cmDefinitions]");
  }
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
  sVar4 = std::vector<cmDefinitions,_std::allocator<cmDefinitions>_>::size(&this->Data);
  if (sVar3 == sVar4) {
    it_00.Position = (PositionType)it_local.Tree;
    it_00.Tree = this_local;
    bVar2 = IsLast(this,it_00);
    iterator::operator++((iterator *)&this_local);
    if (bVar2) {
      std::vector<cmDefinitions,_std::allocator<cmDefinitions>_>::pop_back(&this->Data);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->UpPositions);
    }
    iVar1.Position = (PositionType)it_local.Tree;
    iVar1.Tree = this_local;
    return iVar1;
  }
  __assert_fail("this->UpPositions.size() == this->Data.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                ,0xa3,"iterator cmLinkedTree<cmDefinitions>::Pop(iterator) [T = cmDefinitions]");
}

Assistant:

iterator Pop(iterator it)
    {
    assert(!this->Data.empty());
    assert(this->UpPositions.size() == this->Data.size());
    bool const isLast = this->IsLast(it);
    ++it;
    // If this is the last entry then no other entry can refer
    // to it so we can drop its storage.
    if (isLast)
      {
      this->Data.pop_back();
      this->UpPositions.pop_back();
      }
    return it;
    }